

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

WId __thiscall QWidget::effectiveWinId(QWidget *this)

{
  bool bVar1;
  QWidget *this_00;
  QWidget *in_RDI;
  QWidget *realParent;
  WId id;
  QWidget *in_stack_ffffffffffffffe0;
  WId local_8;
  
  local_8 = internalWinId(in_RDI);
  if ((local_8 == 0) &&
     (bVar1 = testAttribute((QWidget *)0x0,
                            (WidgetAttribute)((ulong)in_stack_ffffffffffffffe0 >> 0x20)), bVar1)) {
    this_00 = nativeParentWidget(in_stack_ffffffffffffffe0);
    if (this_00 == (QWidget *)0x0) {
      local_8 = 0;
    }
    else {
      local_8 = internalWinId(this_00);
    }
  }
  return local_8;
}

Assistant:

WId QWidget::effectiveWinId() const
{
    const WId id = internalWinId();
    if (id || !testAttribute(Qt::WA_WState_Created))
        return id;
    if (const QWidget *realParent = nativeParentWidget())
        return realParent->internalWinId();
    return 0;
}